

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

void V_Init2(void)

{
  uint32 *puVar1;
  PClass *pPVar2;
  DFrameBuffer *pDVar3;
  DFrameBuffer *pDVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  DFrameBuffer *s;
  bool bVar7;
  int height;
  int width;
  uint local_1c;
  uint local_18;
  undefined4 local_14;
  
  pDVar3 = screen;
  pPVar2 = DDummyFrameBuffer::RegistrationInfo.MyClass;
  if ((screen->super_DSimpleCanvas).super_DCanvas.super_DObject.Class == (PClass *)0x0) {
    iVar5 = (**(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject)(screen);
    (pDVar3->super_DSimpleCanvas).super_DCanvas.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar5);
  }
  pDVar4 = screen;
  pPVar6 = (pDVar3->super_DSimpleCanvas).super_DCanvas.super_DObject.Class;
  bVar7 = pPVar6 != (PClass *)0x0;
  if (pPVar6 != pPVar2 && bVar7) {
    do {
      pPVar6 = pPVar6->ParentClass;
      bVar7 = pPVar6 != (PClass *)0x0;
      if (pPVar6 == pPVar2) break;
    } while (pPVar6 != (PClass *)0x0);
  }
  if (bVar7) {
    local_18 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    local_1c = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    local_14 = *(undefined4 *)
                &screen[1].super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject;
    screen = (DFrameBuffer *)0x0;
    puVar1 = &(pDVar4->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    if (pDVar4 != (DFrameBuffer *)0x0) {
      (*(pDVar4->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[2])();
    }
    I_InitGraphics();
    I_ClosestResolution((int *)&local_18,(int *)&local_1c,8);
    iVar5 = (*Video->_vptr_IVideo[7])(Video,(ulong)local_18,(ulong)local_1c,8);
    if ((char)iVar5 == '\0') {
      I_FatalError("Could not set resolution to %d x %d x %d",(ulong)local_18,(ulong)local_1c,8);
    }
    else {
      Printf("Resolution: %d x %d\n",(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
             (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height);
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1d])(local_14);
    (*Renderer->_vptr_FRenderer[5])();
    FBaseCVar::ResetColors();
    C_NewModeAdjust();
    M_InitVideoModesMenu();
    V_SetBorderNeedRefresh();
    setsizeneeded = true;
    return;
  }
  __assert_fail("screen->IsKindOf(RUNTIME_CLASS(DDummyFrameBuffer))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                ,0x61c,"void V_Init2()");
}

Assistant:

void V_Init2()
{
	assert (screen->IsKindOf(RUNTIME_CLASS(DDummyFrameBuffer)));
	int width = screen->GetWidth();
	int height = screen->GetHeight();
	float gamma = static_cast<DDummyFrameBuffer *>(screen)->Gamma;

	{
		DFrameBuffer *s = screen;
		screen = NULL;
		s->ObjectFlags |= OF_YesReallyDelete;
		delete s;
	}

	I_InitGraphics();
	I_ClosestResolution (&width, &height, 8);

	if (!Video->SetResolution (width, height, 8))
		I_FatalError ("Could not set resolution to %d x %d x %d", width, height, 8);
	else
		Printf ("Resolution: %d x %d\n", SCREENWIDTH, SCREENHEIGHT);

	screen->SetGamma (gamma);
	Renderer->RemapVoxels();
	FBaseCVar::ResetColors ();
	C_NewModeAdjust();
	M_InitVideoModesMenu();
	V_SetBorderNeedRefresh();
	setsizeneeded = true;
}